

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# picker.cpp
# Opt level: O1

void __thiscall QtMWidgets::Picker::mousePressEvent(Picker *this,QMouseEvent *event)

{
  int iVar1;
  PickerPrivate *pPVar2;
  QPoint QVar3;
  double dVar4;
  double in_XMM1_Qa;
  
  iVar1 = *(int *)(event + 0x40);
  if (iVar1 == 1) {
    pPVar2 = (this->d).d;
    pPVar2->mouseWasMoved = false;
    pPVar2->mouseMoveDelta = 0;
    dVar4 = (double)QEventPoint::position();
    QVar3.xp = (int)((double)((ulong)dVar4 & 0x8000000000000000 | 0x3fe0000000000000) + dVar4);
    QVar3.yp = (int)((double)((ulong)in_XMM1_Qa & 0x8000000000000000 | 0x3fe0000000000000) +
                    in_XMM1_Qa);
    ((this->d).d)->mousePos = QVar3;
    ((this->d).d)->leftMouseButtonPressed = true;
  }
  event[0xc] = (QMouseEvent)(iVar1 == 1);
  return;
}

Assistant:

void
Picker::mousePressEvent( QMouseEvent * event )
{
	if( event->button() == Qt::LeftButton )
	{
		d->mouseWasMoved = false;
		d->mouseMoveDelta = 0;
		d->mousePos = event->pos();
		d->leftMouseButtonPressed = true;

		event->accept();
	}
	else
		event->ignore();
}